

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAgi.c
# Opt level: O1

void Agi_ManTest(Gia_Man_t *pGia)

{
  Agi_Man_t *p;
  
  Gia_ManSuppSizeTest(pGia);
  p = Agi_ManFromGia(pGia);
  Agi_ManSuppSizeTest(p);
  Agi_ManFree(p);
  return;
}

Assistant:

void Agi_ManTest( Gia_Man_t * pGia )
{
    extern int Gia_ManSuppSizeTest( Gia_Man_t * p );
    Agi_Man_t * p;
    Gia_ManSuppSizeTest( pGia );
    p = Agi_ManFromGia( pGia );
    Agi_ManSuppSizeTest( p );
    Agi_ManFree( p );
}